

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O1

void __thiscall t_markdown_generator::generate_program_toc(t_markdown_generator *this)

{
  ofstream_with_content_based_conditional_update *poVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  undefined8 uStack_28;
  
  poVar1 = &this->f_out_;
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"| Module | Services & Functions | Data types | Constants |",0x3a);
  uStack_28._0_6_ = CONCAT15(10,(undefined5)uStack_28);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(char *)((long)&uStack_28 + 5),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"| --- | --- | --- | --- |",0x19);
  uStack_28._0_7_ = CONCAT16(10,(undefined6)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_28 + 6),1);
  generate_program_toc_row(this,(this->super_t_generator).program_);
  uStack_28 = CONCAT17(10,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,(char *)((long)&uStack_28 + 7),1);
  return;
}

Assistant:

void t_markdown_generator::generate_program_toc() {
  f_out_ << "| Module | Services & Functions | Data types | Constants |" << endl 
         << "| --- | --- | --- | --- |" << endl;
  generate_program_toc_row(program_);
  f_out_ << endl;
}